

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cpp
# Opt level: O0

int __thiscall CEditorMap::Save(CEditorMap *this,IStorage *pStorage,char *pFileName)

{
  long lVar1;
  CEditorImage *pCVar2;
  CLayerGroup *pCVar3;
  CLayer *pCVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  IConsole *pIVar9;
  CEditorImage **ppCVar10;
  CLayerGroup **ppCVar11;
  CLayer **ppCVar12;
  CEnvelope **ppCVar13;
  CEnvPoint *pCVar14;
  IClient *pIVar15;
  long in_FS_OFFSET;
  char *in_stack_ffffffffffffd848;
  undefined4 in_stack_ffffffffffffd850;
  undefined4 in_stack_ffffffffffffd854;
  undefined8 in_stack_ffffffffffffd858;
  int in_stack_ffffffffffffd860;
  int in_stack_ffffffffffffd864;
  CDataFileWriter *in_stack_ffffffffffffd868;
  undefined4 in_stack_ffffffffffffd870;
  int in_stack_ffffffffffffd874;
  undefined4 uVar16;
  CDataFileWriter *in_stack_ffffffffffffd878;
  CEditorImage *in_stack_ffffffffffffd880;
  int p_1;
  int e_2;
  int Offset;
  uchar *pPoints;
  int TotalSize;
  int e_1;
  int PointCount;
  int p;
  int e;
  int Size;
  int Version;
  CLayerQuads *pLayer_1;
  CLayerTiles *pLayer;
  int l;
  CLayerGroup *pGroup;
  int g;
  int GroupCount;
  int LayerCount;
  int PixelSize;
  CEditorImage *pImg;
  int i;
  char *pFileName_local;
  IStorage *pStorage_local;
  CEditorMap *this_local;
  int local_2560;
  CMapItemImage Item_2;
  CMapItemInfo Item_1;
  CMapItemVersion Item;
  CDataFileWriter df;
  char aMapName [128];
  CServerInfo CurrentServerInfo;
  CMapItemEnvelope Item_5;
  CMapItemLayerQuads Item_4;
  CMapItemLayerTilemap Item_3;
  CMapItemGroup GItem;
  char aBuf [256];
  
  CurrentServerInfo.m_aClients[0x24].m_aClan[0x17] = '\0';
  CurrentServerInfo.m_aClients[0x24].m_aClan[0x18] = '\0';
  CurrentServerInfo.m_aClients[0x24].m_aClan[0x19] = '\0';
  CurrentServerInfo.m_aClients[0x24].m_aClan[0x1a] = '\0';
  CurrentServerInfo.m_aClients[0x24].m_aClan[0x1b] = '\0';
  CurrentServerInfo.m_aClients[0x24].m_aClan[0x1c] = '\0';
  CurrentServerInfo.m_aClients[0x24].m_aClan[0x1d] = '\0';
  CurrentServerInfo.m_aClients[0x24].m_aClan[0x1e] = '\0';
  CurrentServerInfo.m_aClients[5].m_aClan[0x13] = '\0';
  CurrentServerInfo.m_aClients[5].m_aClan[0x14] = '\0';
  CurrentServerInfo.m_aClients[5].m_aClan[0x15] = '\0';
  CurrentServerInfo.m_aClients[5].m_aClan[0x16] = '\0';
  CurrentServerInfo.m_aClients[5].m_aClan[0x17] = '\0';
  CurrentServerInfo.m_aClients[5].m_aClan[0x18] = '\0';
  CurrentServerInfo.m_aClients[5].m_aClan[0x19] = '\0';
  CurrentServerInfo.m_aClients[5].m_aClan[0x1a] = '\0';
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  str_format(aBuf,0x100,"saving to \'%s\'...",pFileName);
  pIVar9 = CEditor::Console(this->m_pEditor);
  (*(pIVar9->super_IInterface)._vptr_IInterface[0x19])(pIVar9,0,"editor",aBuf);
  CDataFileWriter::CDataFileWriter
            ((CDataFileWriter *)CONCAT44(in_stack_ffffffffffffd854,in_stack_ffffffffffffd850));
  bVar5 = CDataFileWriter::Open
                    (in_stack_ffffffffffffd878,
                     (IStorage *)CONCAT44(in_stack_ffffffffffffd874,in_stack_ffffffffffffd870),
                     (char *)in_stack_ffffffffffffd868);
  if (bVar5) {
    CDataFileWriter::AddItem
              (in_stack_ffffffffffffd868,in_stack_ffffffffffffd864,in_stack_ffffffffffffd860,
               (int)((ulong)in_stack_ffffffffffffd858 >> 0x20),
               (void *)CONCAT44(in_stack_ffffffffffffd854,in_stack_ffffffffffffd850));
    if ((this->m_MapInfo).m_aAuthor[0] != '\0') {
      str_length((char *)0x209cfd);
      CDataFileWriter::AddData
                (in_stack_ffffffffffffd878,in_stack_ffffffffffffd874,in_stack_ffffffffffffd868);
    }
    if ((this->m_MapInfo).m_aVersion[0] != '\0') {
      str_length((char *)0x209d6b);
      CDataFileWriter::AddData
                (in_stack_ffffffffffffd878,in_stack_ffffffffffffd874,in_stack_ffffffffffffd868);
    }
    if ((this->m_MapInfo).m_aCredits[0] != '\0') {
      str_length((char *)0x209dd9);
      CDataFileWriter::AddData
                (in_stack_ffffffffffffd878,in_stack_ffffffffffffd874,in_stack_ffffffffffffd868);
    }
    if ((this->m_MapInfo).m_aLicense[0] != '\0') {
      str_length((char *)0x209e4d);
      CDataFileWriter::AddData
                (in_stack_ffffffffffffd878,in_stack_ffffffffffffd874,in_stack_ffffffffffffd868);
    }
    CDataFileWriter::AddItem
              (in_stack_ffffffffffffd868,in_stack_ffffffffffffd864,in_stack_ffffffffffffd860,
               (int)((ulong)in_stack_ffffffffffffd858 >> 0x20),
               (void *)CONCAT44(in_stack_ffffffffffffd854,in_stack_ffffffffffffd850));
    for (i = 0; iVar6 = array<CEditorImage_*,_allocator_default<CEditorImage_*>_>::size
                                  (&this->m_lImages), i < iVar6; i = i + 1) {
      ppCVar10 = array<CEditorImage_*,_allocator_default<CEditorImage_*>_>::operator[]
                           (&this->m_lImages,i);
      pCVar2 = *ppCVar10;
      CEditorImage::AnalyzeTileFlags(in_stack_ffffffffffffd880);
      str_length((char *)0x209fa0);
      CDataFileWriter::AddData
                (in_stack_ffffffffffffd878,in_stack_ffffffffffffd874,in_stack_ffffffffffffd868);
      if (pCVar2->m_External == 0) {
        CDataFileWriter::AddData
                  (in_stack_ffffffffffffd878,in_stack_ffffffffffffd874,in_stack_ffffffffffffd868);
      }
      CDataFileWriter::AddItem
                (in_stack_ffffffffffffd868,in_stack_ffffffffffffd864,in_stack_ffffffffffffd860,
                 (int)((ulong)in_stack_ffffffffffffd858 >> 0x20),
                 (void *)CONCAT44(in_stack_ffffffffffffd854,in_stack_ffffffffffffd850));
    }
    for (g = 0; iVar6 = array<CLayerGroup_*,_allocator_default<CLayerGroup_*>_>::size
                                  (&this->m_lGroups), g < iVar6; g = g + 1) {
      ppCVar11 = array<CLayerGroup_*,_allocator_default<CLayerGroup_*>_>::operator[]
                           (&this->m_lGroups,g);
      pCVar3 = *ppCVar11;
      if ((pCVar3->m_SaveToMap & 1U) != 0) {
        StrToInts((int *)CONCAT44(in_stack_ffffffffffffd864,in_stack_ffffffffffffd860),
                  (int)((ulong)in_stack_ffffffffffffd858 >> 0x20),
                  (char *)CONCAT44(in_stack_ffffffffffffd854,in_stack_ffffffffffffd850));
        for (l = 0; iVar6 = array<CLayer_*,_allocator_default<CLayer_*>_>::size(&pCVar3->m_lLayers),
            l < iVar6; l = l + 1) {
          ppCVar12 = array<CLayer_*,_allocator_default<CLayer_*>_>::operator[](&pCVar3->m_lLayers,l)
          ;
          if (((*ppCVar12)->m_SaveToMap & 1U) != 0) {
            ppCVar12 = array<CLayer_*,_allocator_default<CLayer_*>_>::operator[]
                                 (&pCVar3->m_lLayers,l);
            if ((*ppCVar12)->m_Type == 2) {
              pIVar9 = CEditor::Console(this->m_pEditor);
              (*(pIVar9->super_IInterface)._vptr_IInterface[0x19])
                        (pIVar9,1,"editor","saving tiles layer",0);
              array<CLayer_*,_allocator_default<CLayer_*>_>::operator[](&pCVar3->m_lLayers,l);
              CLayerTiles::PrepareForSave((CLayerTiles *)in_stack_ffffffffffffd880);
              CDataFileWriter::AddData
                        (in_stack_ffffffffffffd878,in_stack_ffffffffffffd874,
                         in_stack_ffffffffffffd868);
              StrToInts((int *)CONCAT44(in_stack_ffffffffffffd864,in_stack_ffffffffffffd860),
                        (int)((ulong)in_stack_ffffffffffffd858 >> 0x20),
                        (char *)CONCAT44(in_stack_ffffffffffffd854,in_stack_ffffffffffffd850));
              CDataFileWriter::AddItem
                        (in_stack_ffffffffffffd868,in_stack_ffffffffffffd864,
                         in_stack_ffffffffffffd860,(int)((ulong)in_stack_ffffffffffffd858 >> 0x20),
                         (void *)CONCAT44(in_stack_ffffffffffffd854,in_stack_ffffffffffffd850));
            }
            else {
              ppCVar12 = array<CLayer_*,_allocator_default<CLayer_*>_>::operator[]
                                   (&pCVar3->m_lLayers,l);
              if ((*ppCVar12)->m_Type == 3) {
                pIVar9 = CEditor::Console(this->m_pEditor);
                (*(pIVar9->super_IInterface)._vptr_IInterface[0x19])
                          (pIVar9,1,"editor","saving quads layer",0);
                ppCVar12 = array<CLayer_*,_allocator_default<CLayer_*>_>::operator[]
                                     (&pCVar3->m_lLayers,l);
                pCVar4 = *ppCVar12;
                iVar6 = array<CQuad,_allocator_default<CQuad>_>::size
                                  ((array<CQuad,_allocator_default<CQuad>_> *)&pCVar4[1].m_pEditor);
                if (iVar6 != 0) {
                  array<CQuad,_allocator_default<CQuad>_>::size
                            ((array<CQuad,_allocator_default<CQuad>_> *)&pCVar4[1].m_pEditor);
                  array<CQuad,_allocator_default<CQuad>_>::size
                            ((array<CQuad,_allocator_default<CQuad>_> *)&pCVar4[1].m_pEditor);
                  array<CQuad,_allocator_default<CQuad>_>::base_ptr
                            ((array<CQuad,_allocator_default<CQuad>_> *)&pCVar4[1].m_pEditor);
                  CDataFileWriter::AddDataSwapped
                            ((CDataFileWriter *)
                             CONCAT44(in_stack_ffffffffffffd864,in_stack_ffffffffffffd860),
                             (int)((ulong)in_stack_ffffffffffffd858 >> 0x20),
                             (void *)CONCAT44(in_stack_ffffffffffffd854,in_stack_ffffffffffffd850));
                  StrToInts((int *)CONCAT44(in_stack_ffffffffffffd864,in_stack_ffffffffffffd860),
                            (int)((ulong)in_stack_ffffffffffffd858 >> 0x20),
                            (char *)CONCAT44(in_stack_ffffffffffffd854,in_stack_ffffffffffffd850));
                  CDataFileWriter::AddItem
                            (in_stack_ffffffffffffd868,in_stack_ffffffffffffd864,
                             in_stack_ffffffffffffd860,
                             (int)((ulong)in_stack_ffffffffffffd858 >> 0x20),
                             (void *)CONCAT44(in_stack_ffffffffffffd854,in_stack_ffffffffffffd850));
                }
              }
            }
          }
        }
        CDataFileWriter::AddItem
                  (in_stack_ffffffffffffd868,in_stack_ffffffffffffd864,in_stack_ffffffffffffd860,
                   (int)((ulong)in_stack_ffffffffffffd858 >> 0x20),
                   (void *)CONCAT44(in_stack_ffffffffffffd854,in_stack_ffffffffffffd850));
      }
    }
    for (e = 0; iVar6 = array<CEnvelope_*,_allocator_default<CEnvelope_*>_>::size
                                  (&this->m_lEnvelopes), e < iVar6; e = e + 1) {
      p = 0;
      while( true ) {
        iVar6 = p;
        ppCVar13 = array<CEnvelope_*,_allocator_default<CEnvelope_*>_>::operator[]
                             (&this->m_lEnvelopes,e);
        iVar7 = array<CEnvPoint,_allocator_default<CEnvPoint>_>::size(&(*ppCVar13)->m_lPoints);
        if (iVar7 <= iVar6) break;
        ppCVar13 = array<CEnvelope_*,_allocator_default<CEnvelope_*>_>::operator[]
                             (&this->m_lEnvelopes,e);
        pCVar14 = array<CEnvPoint,_allocator_default<CEnvPoint>_>::operator[]
                            (&(*ppCVar13)->m_lPoints,p);
        if ((pCVar14->super_CEnvPoint_v1).m_Curvetype == 5) break;
        p = p + 1;
      }
    }
    for (e_1 = 0; iVar6 = array<CEnvelope_*,_allocator_default<CEnvelope_*>_>::size
                                    (&this->m_lEnvelopes), e_1 < iVar6; e_1 = e_1 + 1) {
      array<CEnvelope_*,_allocator_default<CEnvelope_*>_>::operator[](&this->m_lEnvelopes,e_1);
      ppCVar13 = array<CEnvelope_*,_allocator_default<CEnvelope_*>_>::operator[]
                           (&this->m_lEnvelopes,e_1);
      array<CEnvPoint,_allocator_default<CEnvPoint>_>::size(&(*ppCVar13)->m_lPoints);
      array<CEnvelope_*,_allocator_default<CEnvelope_*>_>::operator[](&this->m_lEnvelopes,e_1);
      array<CEnvelope_*,_allocator_default<CEnvelope_*>_>::operator[](&this->m_lEnvelopes,e_1);
      StrToInts((int *)CONCAT44(in_stack_ffffffffffffd864,in_stack_ffffffffffffd860),
                (int)((ulong)in_stack_ffffffffffffd858 >> 0x20),
                (char *)CONCAT44(in_stack_ffffffffffffd854,in_stack_ffffffffffffd850));
      CDataFileWriter::AddItem
                (in_stack_ffffffffffffd868,in_stack_ffffffffffffd864,in_stack_ffffffffffffd860,
                 (int)((ulong)in_stack_ffffffffffffd858 >> 0x20),
                 (void *)CONCAT44(in_stack_ffffffffffffd854,in_stack_ffffffffffffd850));
    }
    mem_alloc(0);
    e_2 = 0;
    while (iVar6 = e_2,
          iVar7 = array<CEnvelope_*,_allocator_default<CEnvelope_*>_>::size(&this->m_lEnvelopes),
          iVar6 < iVar7) {
      p_1 = 0;
      while( true ) {
        ppCVar13 = array<CEnvelope_*,_allocator_default<CEnvelope_*>_>::operator[]
                             (&this->m_lEnvelopes,e_2);
        iVar6 = array<CEnvPoint,_allocator_default<CEnvPoint>_>::size(&(*ppCVar13)->m_lPoints);
        if (iVar6 <= p_1) break;
        ppCVar13 = array<CEnvelope_*,_allocator_default<CEnvelope_*>_>::operator[]
                             (&this->m_lEnvelopes,e_2);
        array<CEnvPoint,_allocator_default<CEnvPoint>_>::operator[](&(*ppCVar13)->m_lPoints,p_1);
        mem_copy((void *)CONCAT44(in_stack_ffffffffffffd854,in_stack_ffffffffffffd850),
                 in_stack_ffffffffffffd848,0);
        p_1 = p_1 + 1;
      }
      e_2 = e_2 + 1;
    }
    CDataFileWriter::AddItem
              (in_stack_ffffffffffffd868,in_stack_ffffffffffffd864,in_stack_ffffffffffffd860,
               (int)((ulong)in_stack_ffffffffffffd858 >> 0x20),
               (void *)CONCAT44(in_stack_ffffffffffffd854,in_stack_ffffffffffffd850));
    mem_free((void *)0x20ac80);
    CDataFileWriter::Finish((CDataFileWriter *)CONCAT44(iVar7,iVar6));
    pIVar9 = CEditor::Console(this->m_pEditor);
    (*(pIVar9->super_IInterface)._vptr_IInterface[0x19])(pIVar9,1,"editor","saving done",0);
    pIVar15 = CEditor::Client(this->m_pEditor);
    uVar8 = (*(pIVar15->super_IInterface)._vptr_IInterface[0x1a])();
    uVar16 = CONCAT13((char)uVar8,(int3)in_stack_ffffffffffffd874);
    if ((uVar8 & 1) != 0) {
      pIVar15 = CEditor::Client(this->m_pEditor);
      (*(pIVar15->super_IInterface)._vptr_IInterface[0x1d])(pIVar15,&CurrentServerInfo);
      CEditor::ExtractName
                ((char *)CONCAT44(uVar16,in_stack_ffffffffffffd870),(char *)pIVar15,
                 in_stack_ffffffffffffd864);
      iVar6 = str_comp((char *)CONCAT44(in_stack_ffffffffffffd854,in_stack_ffffffffffffd850),
                       in_stack_ffffffffffffd848);
      if (iVar6 == 0) {
        pIVar15 = CEditor::Client(this->m_pEditor);
        (*(pIVar15->super_IInterface)._vptr_IInterface[0x1c])(pIVar15,"reload");
      }
    }
    local_2560 = 1;
  }
  else {
    str_format(aBuf,0x100,"failed to open file \'%s\'...",pFileName);
    pIVar9 = CEditor::Console(this->m_pEditor);
    (*(pIVar9->super_IInterface)._vptr_IInterface[0x19])(pIVar9,0,"editor",aBuf);
    local_2560 = 0;
  }
  CDataFileWriter::~CDataFileWriter
            ((CDataFileWriter *)CONCAT44(in_stack_ffffffffffffd854,in_stack_ffffffffffffd850));
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_2560;
}

Assistant:

int CEditorMap::Save(class IStorage *pStorage, const char *pFileName)
{
	char aBuf[256];
	str_format(aBuf, sizeof(aBuf), "saving to '%s'...", pFileName);
	m_pEditor->Console()->Print(IConsole::OUTPUT_LEVEL_STANDARD, "editor", aBuf);
	CDataFileWriter df;
	if(!df.Open(pStorage, pFileName))
	{
		str_format(aBuf, sizeof(aBuf), "failed to open file '%s'...", pFileName);
		m_pEditor->Console()->Print(IConsole::OUTPUT_LEVEL_STANDARD, "editor", aBuf);
		return 0;
	}

	// save version
	{
		CMapItemVersion Item;
		Item.m_Version = CMapItemVersion::CURRENT_VERSION;
		df.AddItem(MAPITEMTYPE_VERSION, 0, sizeof(Item), &Item);
	}

	// save map info
	{
		CMapItemInfo Item;
		Item.m_Version = CMapItemInfo::CURRENT_VERSION;

		if(m_MapInfo.m_aAuthor[0])
			Item.m_Author = df.AddData(str_length(m_MapInfo.m_aAuthor)+1, m_MapInfo.m_aAuthor);
		else
			Item.m_Author = -1;
		if(m_MapInfo.m_aVersion[0])
			Item.m_MapVersion = df.AddData(str_length(m_MapInfo.m_aVersion)+1, m_MapInfo.m_aVersion);
		else
			Item.m_MapVersion = -1;
		if(m_MapInfo.m_aCredits[0])
			Item.m_Credits = df.AddData(str_length(m_MapInfo.m_aCredits)+1, m_MapInfo.m_aCredits);
		else
			Item.m_Credits = -1;
		if(m_MapInfo.m_aLicense[0])
			Item.m_License = df.AddData(str_length(m_MapInfo.m_aLicense)+1, m_MapInfo.m_aLicense);
		else
			Item.m_License = -1;

		df.AddItem(MAPITEMTYPE_INFO, 0, sizeof(Item), &Item);
	}

	// save images
	for(int i = 0; i < m_lImages.size(); i++)
	{
		CEditorImage *pImg = m_lImages[i];

		// analyze the image for when saving (should be done when we load the image)
		// TODO!
		pImg->AnalyzeTileFlags();

		CMapItemImage Item;
		Item.m_Version = CMapItemImage::CURRENT_VERSION;

		Item.m_Width = pImg->m_Width;
		Item.m_Height = pImg->m_Height;
		Item.m_External = pImg->m_External;
		Item.m_ImageName = df.AddData(str_length(pImg->m_aName)+1, pImg->m_aName);
		if(pImg->m_External)
			Item.m_ImageData = -1;
		else
		{
			int PixelSize = pImg->m_Format == CImageInfo::FORMAT_RGB ? 3 : 4;
			Item.m_ImageData = df.AddData(Item.m_Width*Item.m_Height*PixelSize, pImg->m_pData);
		}
		Item.m_Format = pImg->m_Format;
		df.AddItem(MAPITEMTYPE_IMAGE, i, sizeof(Item), &Item);
	}

	// save layers
	int LayerCount = 0, GroupCount = 0;
	for(int g = 0; g < m_lGroups.size(); g++)
	{
		CLayerGroup *pGroup = m_lGroups[g];
		if(!pGroup->m_SaveToMap)
			continue;

		CMapItemGroup GItem;
		GItem.m_Version = CMapItemGroup::CURRENT_VERSION;

		GItem.m_ParallaxX = pGroup->m_ParallaxX;
		GItem.m_ParallaxY = pGroup->m_ParallaxY;
		GItem.m_OffsetX = pGroup->m_OffsetX;
		GItem.m_OffsetY = pGroup->m_OffsetY;
		GItem.m_UseClipping = pGroup->m_UseClipping;
		GItem.m_ClipX = pGroup->m_ClipX;
		GItem.m_ClipY = pGroup->m_ClipY;
		GItem.m_ClipW = pGroup->m_ClipW;
		GItem.m_ClipH = pGroup->m_ClipH;
		GItem.m_StartLayer = LayerCount;
		GItem.m_NumLayers = 0;

		// save group name
		StrToInts(GItem.m_aName, sizeof(GItem.m_aName)/sizeof(int), pGroup->m_aName);

		for(int l = 0; l < pGroup->m_lLayers.size(); l++)
		{
			if(!pGroup->m_lLayers[l]->m_SaveToMap)
				continue;

			if(pGroup->m_lLayers[l]->m_Type == LAYERTYPE_TILES)
			{
				m_pEditor->Console()->Print(IConsole::OUTPUT_LEVEL_ADDINFO, "editor", "saving tiles layer");
				CLayerTiles *pLayer = (CLayerTiles *)pGroup->m_lLayers[l];
				pLayer->PrepareForSave();

				CMapItemLayerTilemap Item;
				Item.m_Version = CMapItemLayerTilemap::CURRENT_VERSION;

				Item.m_Layer.m_Version = 0; // unused
				Item.m_Layer.m_Flags = pLayer->m_Flags;
				Item.m_Layer.m_Type = pLayer->m_Type;

				Item.m_Color = pLayer->m_Color;
				Item.m_ColorEnv = pLayer->m_ColorEnv;
				Item.m_ColorEnvOffset = pLayer->m_ColorEnvOffset;

				Item.m_Width = pLayer->m_Width;
				Item.m_Height = pLayer->m_Height;
				Item.m_Flags = pLayer->m_Game ? TILESLAYERFLAG_GAME : 0;
				Item.m_Image = pLayer->m_Image;
				Item.m_Data = df.AddData(pLayer->m_SaveTilesSize, pLayer->m_pSaveTiles);

				// save layer name
				StrToInts(Item.m_aName, sizeof(Item.m_aName)/sizeof(int), pLayer->m_aName);

				df.AddItem(MAPITEMTYPE_LAYER, LayerCount, sizeof(Item), &Item);

				GItem.m_NumLayers++;
				LayerCount++;
			}
			else if(pGroup->m_lLayers[l]->m_Type == LAYERTYPE_QUADS)
			{
				m_pEditor->Console()->Print(IConsole::OUTPUT_LEVEL_ADDINFO, "editor", "saving quads layer");
				CLayerQuads *pLayer = (CLayerQuads *)pGroup->m_lLayers[l];
				if(pLayer->m_lQuads.size())
				{
					CMapItemLayerQuads Item;
					Item.m_Version = CMapItemLayerQuads::CURRENT_VERSION;
					Item.m_Layer.m_Version = 0; // unused
					Item.m_Layer.m_Flags = pLayer->m_Flags;
					Item.m_Layer.m_Type = pLayer->m_Type;
					Item.m_Image = pLayer->m_Image;

					// add the data
					Item.m_NumQuads = pLayer->m_lQuads.size();
					Item.m_Data = df.AddDataSwapped(pLayer->m_lQuads.size()*sizeof(CQuad), pLayer->m_lQuads.base_ptr());

					// save layer name
					StrToInts(Item.m_aName, sizeof(Item.m_aName)/sizeof(int), pLayer->m_aName);

					df.AddItem(MAPITEMTYPE_LAYER, LayerCount, sizeof(Item), &Item);

					GItem.m_NumLayers++;
					LayerCount++;
				}
			}
		}

		df.AddItem(MAPITEMTYPE_GROUP, GroupCount++, sizeof(GItem), &GItem);
	}

	// check for bezier curve envelopes, otherwise use older, smaller envelope points
	int Version = CMapItemEnvelope_v2::CURRENT_VERSION;
	int Size = sizeof(CEnvPoint_v1);
	for(int e = 0; e < m_lEnvelopes.size(); e++)
	{
		for(int p = 0; p < m_lEnvelopes[e]->m_lPoints.size(); p++)
		{
			if(m_lEnvelopes[e]->m_lPoints[p].m_Curvetype == CURVETYPE_BEZIER)
			{
				Version = CMapItemEnvelope::CURRENT_VERSION;
				Size = sizeof(CEnvPoint);
				break;
			}
		}
	}

	// save envelopes
	int PointCount = 0;
	for(int e = 0; e < m_lEnvelopes.size(); e++)
	{
		CMapItemEnvelope Item;
		Item.m_Version = Version;
		Item.m_Channels = m_lEnvelopes[e]->m_Channels;
		Item.m_StartPoint = PointCount;
		Item.m_NumPoints = m_lEnvelopes[e]->m_lPoints.size();
		Item.m_Synchronized = m_lEnvelopes[e]->m_Synchronized;
		StrToInts(Item.m_aName, sizeof(Item.m_aName)/sizeof(int), m_lEnvelopes[e]->m_aName);

		df.AddItem(MAPITEMTYPE_ENVELOPE, e, sizeof(Item), &Item);
		PointCount += Item.m_NumPoints;
	}

	// save points
	int TotalSize = Size * PointCount;
	unsigned char *pPoints = (unsigned char *)mem_alloc(TotalSize);
	int Offset = 0;
	for(int e = 0; e < m_lEnvelopes.size(); e++)
	{
		for(int p = 0; p < m_lEnvelopes[e]->m_lPoints.size(); p++)
		{
			mem_copy(pPoints + Offset, &(m_lEnvelopes[e]->m_lPoints[p]), Size);
			Offset += Size;
		}
	}

	df.AddItem(MAPITEMTYPE_ENVPOINTS, 0, TotalSize, pPoints);
	mem_free(pPoints);

	// finish the data file
	df.Finish();
	m_pEditor->Console()->Print(IConsole::OUTPUT_LEVEL_ADDINFO, "editor", "saving done");

	// send rcon.. if we can
	if(m_pEditor->Client()->RconAuthed())
	{
		CServerInfo CurrentServerInfo;
		m_pEditor->Client()->GetServerInfo(&CurrentServerInfo);
		char aMapName[128];
		m_pEditor->ExtractName(pFileName, aMapName, sizeof(aMapName));
		if(!str_comp(aMapName, CurrentServerInfo.m_aMap))
			m_pEditor->Client()->Rcon("reload");
	}

	return 1;
}